

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestMessageSetLite::ByteSizeLong(TestMessageSetLite *this)

{
  bool bVar1;
  int desired;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown_fields;
  size_t sVar2;
  size_t local_20;
  size_t total_size;
  TestMessageSetLite *this_;
  TestMessageSetLite *this_local;
  
  local_20 = google::protobuf::internal::ExtensionSet::MessageSetByteSize
                       (&(this->field_0)._impl_._extensions_);
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
                   (&(this->super_MessageLite)._internal_metadata_,
                    google::protobuf::internal::GetEmptyString_abi_cxx11_);
    sVar2 = google::protobuf::internal::ComputeUnknownMessageSetItemsSize(unknown_fields);
    local_20 = sVar2 + local_20;
  }
  desired = google::protobuf::internal::ToCachedSize(local_20);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,desired);
  return local_20;
}

Assistant:

::size_t TestMessageSetLite::ByteSizeLong() const {
  const TestMessageSetLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_set_byte_size_start:proto2_unittest.TestMessageSetLite)
  ::size_t total_size = this_._impl_._extensions_.MessageSetByteSize();
  if (this_._internal_metadata_.have_unknown_fields()) {
    total_size += ::_pbi::ComputeUnknownMessageSetItemsSize(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString));
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}